

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall
QZipStreamStrategy::addFile(QZipStreamStrategy *this,QString *fileName,QString *mimeType)

{
  QAnyStringView *pQVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString *in_stack_fffffffffffffeb8;
  QAnyStringView *in_stack_fffffffffffffec0;
  QAnyStringView *this_00;
  storage_type *local_f0;
  undefined1 local_e0 [40];
  QAnyStringView *local_b8;
  QAnyStringView *local_b0;
  storage_type *local_98;
  undefined1 local_88 [40];
  QAnyStringView *local_60;
  QAnyStringView *local_58;
  storage_type *local_50;
  QAnyStringView local_40 [2];
  QAnyStringView *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QAnyStringView *)(in_RDI + 0x40);
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  QByteArrayView::QByteArrayView<11ul>
            ((QByteArrayView *)in_stack_fffffffffffffec0,(char (*) [11])in_stack_fffffffffffffeb8);
  this_00 = local_40;
  QVar2.m_data = local_50;
  QVar2.m_size = (qsizetype)this_00;
  QString::fromLatin1(QVar2);
  QAnyStringView::QAnyStringView(this_00,in_stack_fffffffffffffeb8);
  QXmlStreamWriter::writeEmptyElement(pQVar1,local_18);
  QString::~QString((QString *)0x9f87be);
  QAnyStringView::QAnyStringView(this_00,in_stack_fffffffffffffeb8);
  QByteArrayView::QByteArrayView<11ul>
            ((QByteArrayView *)this_00,(char (*) [11])in_stack_fffffffffffffeb8);
  QVar3.m_data = local_98;
  QVar3.m_size = (qsizetype)local_88;
  QString::fromLatin1(QVar3);
  QAnyStringView::QAnyStringView(this_00,in_stack_fffffffffffffeb8);
  QAnyStringView::QAnyStringView(this_00,in_stack_fffffffffffffeb8);
  QXmlStreamWriter::writeAttribute(pQVar1,local_60,local_58);
  QString::~QString((QString *)0x9f886c);
  QAnyStringView::QAnyStringView(this_00,in_stack_fffffffffffffeb8);
  QByteArrayView::QByteArrayView<10ul>
            ((QByteArrayView *)this_00,(char (*) [10])in_stack_fffffffffffffeb8);
  QVar4.m_data = local_f0;
  QVar4.m_size = (qsizetype)local_e0;
  QString::fromLatin1(QVar4);
  QAnyStringView::QAnyStringView(this_00,in_stack_fffffffffffffeb8);
  QAnyStringView::QAnyStringView(this_00,in_stack_fffffffffffffeb8);
  QXmlStreamWriter::writeAttribute(pQVar1,local_b8,local_b0);
  QString::~QString((QString *)0x9f8908);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addFile(const QString &fileName, const QString &mimeType)
    {
        manifestWriter.writeEmptyElement(manifestNS, QString::fromLatin1("file-entry"));
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("media-type"), mimeType);
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("full-path"), fileName);
    }